

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clipper.cpp
# Opt level: O3

void __thiscall ClipperLib::PolyOffsetBuilder::DoRound(PolyOffsetBuilder *this)

{
  double dVar1;
  pointer pDVar2;
  pointer pDVar3;
  size_t sVar4;
  long lVar5;
  long lVar6;
  ulong uVar7;
  ulong uVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  Polygon arc;
  Polygon local_50;
  IntPoint local_38;
  IntPoint local_28;
  
  pDVar2 = (this->normals).
           super__Vector_base<ClipperLib::DoublePoint,_std::allocator<ClipperLib::DoublePoint>_>.
           _M_impl.super__Vector_impl_data._M_start;
  lVar6 = *(long *)&(this->m_p).
                    super__Vector_base<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>,_std::allocator<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start[this->m_i].
                    super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>.
                    _M_impl;
  lVar5 = this->m_j * 0x10;
  dVar10 = (double)*(long *)(lVar6 + 8 + lVar5);
  dVar1 = this->m_delta;
  dVar9 = (double)*(long *)(lVar6 + lVar5);
  pDVar3 = pDVar2 + this->m_k;
  dVar11 = pDVar3->X * dVar1 + dVar9;
  dVar12 = pDVar3->Y * dVar1 + dVar10;
  uVar7 = -(ulong)(dVar11 < 0.0);
  uVar8 = -(ulong)(dVar12 < 0.0);
  local_28.X = (long64)((double)(~uVar7 & 0x3fe0000000000000 | uVar7 & 0xbfe0000000000000) + dVar11)
  ;
  local_28.Y = (long64)((double)(~uVar8 & 0x3fe0000000000000 | uVar8 & 0xbfe0000000000000) + dVar12)
  ;
  pDVar2 = pDVar2 + this->m_j;
  dVar9 = pDVar2->X * dVar1 + dVar9;
  dVar10 = pDVar2->Y * dVar1 + dVar10;
  uVar7 = -(ulong)(dVar9 < 0.0);
  uVar8 = -(ulong)(dVar10 < 0.0);
  local_38.X = (long64)((double)(~uVar7 & 0x3fe0000000000000 | uVar7 & 0xbfe0000000000000) + dVar9);
  local_38.Y = (long64)((double)(~uVar8 & 0x3fe0000000000000 | uVar8 & 0xbfe0000000000000) + dVar10)
  ;
  AddPoint(this,&local_28);
  pDVar3 = (this->normals).
           super__Vector_base<ClipperLib::DoublePoint,_std::allocator<ClipperLib::DoublePoint>_>.
           _M_impl.super__Vector_impl_data._M_start;
  sVar4 = this->m_j;
  dVar1 = pDVar3[this->m_k].X;
  dVar9 = pDVar3[this->m_k].Y;
  if (0.0 <= (dVar1 * pDVar3[sVar4].Y - dVar9 * pDVar3[sVar4].X) * this->m_delta) {
    if (pDVar3[sVar4].X * dVar1 + pDVar3[sVar4].Y * dVar9 < 0.985) {
      dVar9 = atan2(dVar9,dVar1);
      pDVar3 = (this->normals).
               super__Vector_base<ClipperLib::DoublePoint,_std::allocator<ClipperLib::DoublePoint>_>
               ._M_impl.super__Vector_impl_data._M_start;
      dVar10 = atan2(pDVar3[this->m_j].Y,pDVar3[this->m_j].X);
      dVar1 = this->m_delta;
      if ((dVar1 <= 0.0) || (dVar9 <= dVar10)) {
        if ((dVar1 < 0.0) && (dVar9 < dVar10)) {
          dVar10 = dVar10 + -6.283185307179586;
        }
      }
      else {
        dVar10 = dVar10 + 6.283185307179586;
      }
      BuildArc(&local_50,
               (IntPoint *)
               (this->m_j * 0x10 +
               *(long *)&(this->m_p).
                         super__Vector_base<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>,_std::allocator<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start[this->m_i].
                         super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>
                         ._M_impl),dVar9,dVar10,dVar1);
      if (local_50.super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>.
          _M_impl.super__Vector_impl_data._M_finish !=
          local_50.super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>.
          _M_impl.super__Vector_impl_data._M_start) {
        lVar6 = 0;
        uVar7 = 0;
        do {
          AddPoint(this,(IntPoint *)
                        ((long)&(local_50.
                                 super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>
                                 ._M_impl.super__Vector_impl_data._M_start)->X + lVar6));
          uVar7 = uVar7 + 1;
          lVar6 = lVar6 + 0x10;
        } while (uVar7 < (ulong)((long)local_50.
                                       super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>
                                       ._M_impl.super__Vector_impl_data._M_finish -
                                 (long)local_50.
                                       super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>
                                       ._M_impl.super__Vector_impl_data._M_start >> 4));
      }
      if (local_50.super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>.
          _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_50.
                        super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>
                        ._M_impl.super__Vector_impl_data._M_start,
                        (long)local_50.
                              super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_50.
                              super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>
                              ._M_impl.super__Vector_impl_data._M_start);
      }
    }
  }
  else {
    AddPoint(this,(IntPoint *)
                  (sVar4 * 0x10 +
                  *(long *)&(this->m_p).
                            super__Vector_base<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>,_std::allocator<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start[this->m_i].
                            super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>
                            ._M_impl));
  }
  AddPoint(this,&local_38);
  return;
}

Assistant:

void DoRound()
{
    IntPoint pt1 = IntPoint((long64)Round(m_p[m_i][m_j].X + normals[m_k].X * m_delta),
        (long64)Round(m_p[m_i][m_j].Y + normals[m_k].Y * m_delta));
    IntPoint pt2 = IntPoint((long64)Round(m_p[m_i][m_j].X + normals[m_j].X * m_delta),
        (long64)Round(m_p[m_i][m_j].Y + normals[m_j].Y * m_delta));
    AddPoint(pt1);
    //round off reflex angles (ie > 180 deg) unless almost flat (ie < ~10deg).
    if ((normals[m_k].X*normals[m_j].Y - normals[m_j].X*normals[m_k].Y) * m_delta >= 0)
    {
      if (normals[m_j].X * normals[m_k].X + normals[m_j].Y * normals[m_k].Y < 0.985)
      {
        double a1 = std::atan2(normals[m_k].Y, normals[m_k].X);
        double a2 = std::atan2(normals[m_j].Y, normals[m_j].X);
        if (m_delta > 0 && a2 < a1) a2 += pi *2;
        else if (m_delta < 0 && a2 > a1) a2 -= pi *2;
        Polygon arc = BuildArc(m_p[m_i][m_j], a1, a2, m_delta);
        for (Polygon::size_type m = 0; m < arc.size(); m++)
          AddPoint(arc[m]);
      }
    }
    else
      AddPoint(m_p[m_i][m_j]);
    AddPoint(pt2);
}